

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::InternalException::InternalException<duckdb::hugeint_t,unsigned_long,unsigned_long>
          (InternalException *this,string *msg,hugeint_t params,unsigned_long params_1,
          unsigned_long params_2)

{
  hugeint_t params_00;
  unsigned_long in_stack_ffffffffffffffc8;
  string local_30;
  
  params_00.lower = params.upper;
  params_00.upper = params_1;
  Exception::ConstructMessage<duckdb::hugeint_t,unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)params.lower,params_00,params_2,
             in_stack_ffffffffffffffc8);
  InternalException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}